

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O0

void sbfTcpMeshHandlerCloseSocket(sbfTcpMeshHandlerConnection c)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x9c) != -1) {
    evutil_closesocket(*(undefined4 *)(in_RDI + 0x9c));
  }
  *(undefined4 *)(in_RDI + 0x9c) = 0xffffffff;
  if (*(long *)(in_RDI + 0xa0) != 0) {
    bufferevent_free(*(undefined8 *)(in_RDI + 0xa0));
  }
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  return;
}

Assistant:

static void
sbfTcpMeshHandlerCloseSocket (sbfTcpMeshHandlerConnection c)
{
    if (c->mSocket != -1)
        EVUTIL_CLOSESOCKET (c->mSocket);
    c->mSocket = -1;

    if (c->mEvent != NULL)
        bufferevent_free (c->mEvent);
    c->mEvent = NULL;
}